

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall MakefileGenerator::buildArgs(MakefileGenerator *this,bool withExtra)

{
  byte bVar1;
  bool bVar2;
  const_iterator o;
  byte in_DL;
  MakefileGenerator *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QString *arg_1;
  add_const_t<QList<QString>_> *__range2;
  QString *arg;
  add_const_t<QList<QString>_> *__range1;
  QString *ret;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  char *in_stack_ffffffffffffff28;
  QStringBuilder<const_char_(&)[2],_QString> *b;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar3;
  const_iterator local_60 [8];
  QString *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  uVar3 = 0;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QString::QString((QString *)0x19837e);
  b = (QStringBuilder<const_char_(&)[2],_QString> *)&Option::globals->qmake_args;
  local_10.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::begin(in_RDI);
  local_18.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QString>::end(in_RDI);
  while( true ) {
    local_20 = local_18.i;
    bVar2 = QList<QString>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar2) break;
    QList<QString>::const_iterator::operator*(&local_10);
    shellQuote(in_RSI,(QString *)in_RDI);
    ::operator+((char (*) [2])in_RSI,(QString *)in_RDI);
    ::operator+=((QString *)CONCAT17(bVar1,CONCAT16(uVar3,in_stack_ffffffffffffff40)),b);
    QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[2],_QString> *)0x198482);
    QString::~QString((QString *)0x19848f);
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (((bVar1 & 1) != 0) && (bVar2 = QList<QString>::isEmpty((QList<QString> *)0x1984c2), !bVar2)) {
    QString::operator+=((QString *)in_RDI,in_stack_ffffffffffffff28);
    local_60[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_60[0] = QList<QString>::begin(in_RDI);
    o = QList<QString>::end(in_RDI);
    while (bVar2 = QList<QString>::const_iterator::operator!=(local_60,o), bVar2) {
      QList<QString>::const_iterator::operator*(local_60);
      shellQuote(in_RSI,(QString *)in_RDI);
      ::operator+((char (*) [2])in_RSI,(QString *)in_RDI);
      ::operator+=((QString *)CONCAT17(bVar1,CONCAT16(uVar3,in_stack_ffffffffffffff40)),b);
      QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[2],_QString> *)0x1985ce);
      QString::~QString((QString *)0x1985d8);
      QList<QString>::const_iterator::operator++(local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::buildArgs(bool withExtra)
{
    QString ret;

    for (const QString &arg : std::as_const(Option::globals->qmake_args))
        ret += " " + shellQuote(arg);
    if (withExtra && !Option::globals->qmake_extra_args.isEmpty()) {
        ret += " --";
        for (const QString &arg : std::as_const(Option::globals->qmake_extra_args))
            ret += " " + shellQuote(arg);
    }
    return ret;
}